

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VScaleAddMultiVectorArray_Serial
              (int nvec,int nsum,realtype *a,N_Vector *X,N_Vector **Y,N_Vector **Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  void *__ptr;
  void *__ptr_00;
  undefined8 *in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  long in_R9;
  N_Vector unaff_retaddr;
  N_Vector *ZZ;
  N_Vector *YY;
  N_Vector in_stack_00000018;
  int retval;
  realtype *zd;
  realtype *yd;
  realtype *xd;
  sunindextype N;
  sunindextype k;
  int j;
  int i;
  N_Vector *Z_00;
  N_Vector *Y_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar7;
  int local_4;
  
  Y_00 = (N_Vector *)0x0;
  Z_00 = (N_Vector *)0x0;
  if (in_EDI < 1) {
    local_4 = -1;
  }
  else if (in_ESI < 1) {
    local_4 = -1;
  }
  else if (in_EDI == 1) {
    if (in_ESI == 1) {
      N_VLinearSum_Serial((realtype)zd,in_stack_00000018,(realtype)YY,(N_Vector)ZZ,unaff_retaddr);
      local_4 = 0;
    }
    else {
      __ptr = malloc((long)in_ESI << 3);
      __ptr_00 = malloc((long)in_ESI << 3);
      for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
        *(undefined8 *)((long)__ptr + (long)iVar5 * 8) = **(undefined8 **)(in_R8 + (long)iVar5 * 8);
        *(undefined8 *)((long)__ptr_00 + (long)iVar5 * 8) =
             **(undefined8 **)(in_R9 + (long)iVar5 * 8);
      }
      local_4 = N_VScaleAddMulti_Serial
                          ((int)in_R9,(realtype *)CONCAT44(in_stack_ffffffffffffffcc,iVar5),
                           (N_Vector)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           Y_00,Z_00);
      free(__ptr);
      free(__ptr_00);
    }
  }
  else if (in_ESI == 1) {
    local_4 = N_VLinearSumVectorArray_Serial
                        ((int)xd,(realtype)yd,(N_Vector *)zd,(realtype)in_stack_00000018,YY,ZZ);
  }
  else {
    iVar5 = **(int **)*in_RCX;
    if (in_R8 == in_R9) {
      for (iVar7 = 0; iVar7 < in_EDI; iVar7 = iVar7 + 1) {
        lVar1 = *(long *)(*(long *)in_RCX[iVar7] + 8);
        for (iVar6 = 0; iVar6 < in_ESI; iVar6 = iVar6 + 1) {
          lVar2 = *(long *)(**(long **)(*(long *)(in_R8 + (long)iVar6 * 8) + (long)iVar7 * 8) + 8);
          for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
            *(double *)(lVar2 + (long)iVar4 * 8) =
                 *(double *)(in_RDX + (long)iVar6 * 8) * *(double *)(lVar1 + (long)iVar4 * 8) +
                 *(double *)(lVar2 + (long)iVar4 * 8);
          }
        }
      }
      local_4 = 0;
    }
    else {
      for (iVar7 = 0; iVar7 < in_EDI; iVar7 = iVar7 + 1) {
        lVar1 = *(long *)(*(long *)in_RCX[iVar7] + 8);
        for (iVar6 = 0; iVar6 < in_ESI; iVar6 = iVar6 + 1) {
          lVar2 = *(long *)(**(long **)(*(long *)(in_R8 + (long)iVar6 * 8) + (long)iVar7 * 8) + 8);
          lVar3 = *(long *)(**(long **)(*(long *)(in_R9 + (long)iVar6 * 8) + (long)iVar7 * 8) + 8);
          for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
            *(double *)(lVar3 + (long)iVar4 * 8) =
                 *(double *)(in_RDX + (long)iVar6 * 8) * *(double *)(lVar1 + (long)iVar4 * 8) +
                 *(double *)(lVar2 + (long)iVar4 * 8);
          }
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int N_VScaleAddMultiVectorArray_Serial(int nvec, int nsum, realtype* a,
                                        N_Vector* X, N_Vector** Y, N_Vector** Z)
{
  int          i, j;
  sunindextype k, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  int          retval;
  N_Vector*   YY;
  N_Vector*   ZZ;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);
  if (nsum < 1) return(-1);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1) {

    /* should have called N_VLinearSum */
    if (nsum == 1) {
      N_VLinearSum_Serial(a[0], X[0], ONE, Y[0][0], Z[0][0]);
      return(0);
    }

    /* should have called N_VScaleAddMulti */
    YY = (N_Vector*) malloc(nsum * sizeof(N_Vector));
    ZZ = (N_Vector*) malloc(nsum * sizeof(N_Vector));

    for (j=0; j<nsum; j++) {
      YY[j] = Y[j][0];
      ZZ[j] = Z[j][0];
    }

    retval = N_VScaleAddMulti_Serial(nsum, a, X[0], YY, ZZ);

    free(YY);
    free(ZZ);
    return(retval);
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 1) {
    retval = N_VLinearSumVectorArray_Serial(nvec, a[0], X, ONE, Y[0], Z[0]);
    return(retval);
  }

  /* ----------------------------
   * Compute multiple linear sums
   * ---------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z) {
    for (i=0; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<nsum; j++){
        yd = NV_DATA_S(Y[j][i]);
        for (k=0; k<N; k++) {
          yd[k] += a[j] * xd[k];
        }
      }
    }
    return(0);
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    for (j=0; j<nsum; j++){
      yd = NV_DATA_S(Y[j][i]);
      zd = NV_DATA_S(Z[j][i]);
      for (k=0; k<N; k++) {
        zd[k] = a[j] * xd[k] + yd[k];
      }
    }
  }
  return(0);
}